

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::SimpleString(SimpleString *this,char *other,size_t repeatCount)

{
  size_t sVar1;
  char *s1;
  bool bVar2;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  sVar1 = StrLen(other);
  setInternalBufferToNewBuffer(this,sVar1 * repeatCount + 1);
  s1 = this->buffer_;
  while (bVar2 = repeatCount != 0, repeatCount = repeatCount - 1, bVar2) {
    StrNCpy(s1,other,sVar1 + 1);
    s1 = s1 + sVar1;
  }
  *s1 = '\0';
  return;
}

Assistant:

SimpleString::SimpleString(const char *other, size_t repeatCount)
    : buffer_(NULLPTR), bufferSize_(0)
{
    size_t otherStringLength = StrLen(other);
    setInternalBufferToNewBuffer(otherStringLength * repeatCount + 1);

    char* next = buffer_;
    for (size_t i = 0; i < repeatCount; i++) {
        StrNCpy(next, other, otherStringLength + 1);
        next += otherStringLength;
    }
    *next = 0;
}